

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.cpp
# Opt level: O3

void __thiscall merlin::cte::update(cte *this)

{
  int iVar1;
  edge *peVar2;
  size_t sVar3;
  double *pdVar4;
  pointer piVar5;
  pointer ppeVar6;
  long lVar7;
  pointer pnVar8;
  ulong uVar9;
  factor *this_00;
  double dVar10;
  variable VX;
  variable local_d8;
  variable_set local_c8;
  factor local_90;
  
  pnVar8 = (this->m_clusters).
           super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_clusters).
      super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>._M_impl.
      super__Vector_impl_data._M_finish != pnVar8) {
    uVar9 = 0;
    do {
      this_00 = &pnVar8[uVar9].belief;
      factor::operator=(this_00,&pnVar8[uVar9].theta);
      ppeVar6 = pnVar8[uVar9].edges.
                super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppeVar6 !=
          pnVar8[uVar9].edges.
          super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pnVar8 = pnVar8 + uVar9;
        do {
          peVar2 = *ppeVar6;
          sVar3 = pnVar8->id;
          if (peVar2->second->id == sVar3) {
            factor::binaryOpIP<merlin::factor::binOpTimes>(this_00,&peVar2->fwd);
            sVar3 = pnVar8->id;
          }
          if (peVar2->first->id == sVar3) {
            factor::binaryOpIP<merlin::factor::binOpTimes>(this_00,&peVar2->bwd);
          }
          ppeVar6 = ppeVar6 + 1;
        } while (ppeVar6 !=
                 (pnVar8->edges).
                 super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      uVar9 = uVar9 + 1;
      pnVar8 = (this->m_clusters).
               super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)(((long)(this->m_clusters).
                                    super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar8 >> 3)
                            * -0x7d05f417d05f417d));
  }
  dVar10 = 0.0;
  for (pdVar4 = (this->m_root->belief).t_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar4 != (this->m_root->belief).t_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
    dVar10 = dVar10 + *pdVar4;
  }
  dVar10 = log(dVar10);
  this->m_logz = dVar10;
  piVar5 = (this->m_var2clique).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_var2clique).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    lVar7 = 0;
    uVar9 = 0;
    do {
      iVar1 = piVar5[uVar9];
      dVar10 = (this->m_gmo).m_dims.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
      local_d8.m_states = (size_t)dVar10;
      pnVar8 = (this->m_clusters).
               super__Vector_base<merlin::detail::node,_std::allocator<merlin::detail::node>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_d8.m_states =
           (long)(dVar10 - 9.223372036854776e+18) & (long)local_d8.m_states >> 0x3f |
           local_d8.m_states;
      local_d8.m_label = uVar9;
      variable_set::variable_set(&local_c8,&local_d8);
      factor::marginal(&local_90,&pnVar8[iVar1].belief,&local_c8);
      factor::operator=((factor *)
                        ((long)&((this->m_beliefs).
                                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar7),
                        &local_90);
      factor::~factor(&local_90);
      variable_set::~variable_set(&local_c8);
      factor::normalize((factor *)
                        ((long)&((this->m_beliefs).
                                 super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_vptr_factor + lVar7));
      uVar9 = uVar9 + 1;
      piVar5 = (this->m_var2clique).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x60;
    } while (uVar9 < (ulong)((long)(this->m_var2clique).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
  }
  return;
}

Assistant:

void cte::update() {

	// Compute the clique beliefs
	for (size_t i = 0; i < m_clusters.size(); ++i) {
		detail::node& cl = m_clusters[i];
		cl.belief = cl.theta;
		for (std::vector<detail::edge*>::iterator ei = cl.edges.begin();
				ei != cl.edges.end(); ++ei) {
			detail::edge* e = (*ei);
			if (e->second->id == cl.id) {
				cl.belief *= e->fwd;
			}
			if (e->first->id == cl.id) {
				cl.belief *= e->bwd;
			}
		}
	}

	// Compute the log partition function
	m_logz = std::log(m_root->belief.sum());

	// Compute the marginals
	for (size_t v = 0; v < m_var2clique.size(); ++v) {
		size_t ci = m_var2clique[v];
		detail::node& cl = m_clusters[ci];
		variable VX = m_gmo.var(v);

		m_beliefs[v] = marg(cl.belief, VX);
		m_beliefs[v].normalize(); // normalize
	}
}